

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

void ggml_quantize_mat_t<4l,(ggml_type)8>(float *x,void *vy,int64_t nrow,int64_t n_per_row)

{
  int64_t in_stack_000001e0;
  void *in_stack_000001e8;
  float *in_stack_000001f0;
  
  ggml_quantize_mat_q8_0_4x4(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
  return;
}

Assistant:

void ggml_quantize_mat_t<4, GGML_TYPE_Q8_0>(const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t nrow, int64_t n_per_row) {
    assert(nrow == 4);
    UNUSED(nrow);
    ggml_quantize_mat_q8_0_4x4(x, vy, n_per_row);
}